

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O2

ostream * Color::operator<<(ostream *os,Modifier *mod)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"\x1b[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,mod->code);
  poVar1 = std::operator<<(poVar1,"m");
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Modifier &mod) {
    return os << "\033[" << mod.code << "m";
  }